

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_buffer.h
# Opt level: O3

cio_write_buffer * cio_write_buffer_queue_dequeue(cio_write_buffer *wbh)

{
  size_t *psVar1;
  cio_write_buffer *pcVar2;
  cio_write_buffer *pcVar3;
  cio_write_buffer *pcVar4;
  
  pcVar4 = (cio_write_buffer *)0x0;
  if (wbh->next != wbh) {
    pcVar4 = wbh->next;
  }
  if (pcVar4 != (cio_write_buffer *)0x0) {
    (wbh->data).head.q_len = (wbh->data).head.q_len - 1;
    psVar1 = &(wbh->data).element.length;
    *psVar1 = *psVar1 - (pcVar4->data).element.length;
    pcVar2 = pcVar4->next;
    pcVar3 = pcVar4->prev;
    pcVar2->prev = pcVar3;
    pcVar3->next = pcVar2;
  }
  return pcVar4;
}

Assistant:

static inline struct cio_write_buffer *cio_write_buffer_queue_peek(const struct cio_write_buffer *wbh)
{
	struct cio_write_buffer *wbe = wbh->next;

	if (wbe == wbh) {
		return NULL;
	}

	return wbe;
}